

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_115e484::DynamicWindowTitler::update_window_title(DynamicWindowTitler *this)

{
  SDL_Window *pSVar1;
  undefined8 uVar2;
  string local_30;
  DynamicWindowTitler *local_10;
  DynamicWindowTitler *this_local;
  
  pSVar1 = this->window_;
  local_10 = this;
  (anonymous_namespace)::DynamicWindowTitler::window_title_abi_cxx11_(&local_30,this);
  uVar2 = std::__cxx11::string::c_str();
  SDL_SetWindowTitle(pSVar1,uVar2);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void update_window_title() {
			SDL_SetWindowTitle(window_, window_title().c_str());
		}